

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_slic_marker.cpp
# Opt level: O2

void __thiscall ms_slic_marker_t::~ms_slic_marker_t(ms_slic_marker_t *this)

{
  ~ms_slic_marker_t(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

ms_slic_marker_t::~ms_slic_marker_t() {
    _clean_up();
}